

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS
ref_part_plt_data(FILE *file,REF_INT nvar,REF_LIST zone_type,REF_LIST zone_packing,
                 REF_LIST zone_nnode,REF_LIST zone_nelem,REF_INT *length,REF_DBL **soln)

{
  undefined4 uVar1;
  FILE *pFVar2;
  uint uVar3;
  size_t sVar4;
  REF_DBL *pRVar5;
  undefined8 uVar6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  undefined8 uVar10;
  REF_INT RVar11;
  long lVar12;
  REF_LIST pRVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  double dVar17;
  float var_float;
  int sharing;
  int passive;
  REF_INT nelem;
  REF_LIST dataformats;
  double var_double;
  REF_INT packing;
  REF_INT zonetype;
  int conn;
  float zonemarker;
  int c2n;
  double maxval;
  double minval;
  uint local_94;
  FILE *local_90;
  float local_88;
  int local_84;
  int local_80;
  int local_7c;
  REF_LIST local_78;
  REF_LIST local_70;
  REF_LIST local_68;
  double local_60;
  int local_58;
  int local_54;
  int local_50;
  REF_INT local_4c;
  float local_48;
  undefined1 local_44 [4];
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  
  local_70 = (REF_LIST)0x0;
  uVar3 = ref_list_create(&local_70);
  if (uVar3 != 0) {
    uVar14 = (ulong)uVar3;
    pcVar9 = "dataformats";
    uVar6 = 0x978;
    goto LAB_001f1905;
  }
  local_90 = (FILE *)file;
  local_78 = zone_nelem;
  local_68 = zone_nnode;
  uVar3 = ref_list_shift(zone_type,&local_54);
  if (uVar3 == 0) {
    uVar3 = ref_list_shift(zone_packing,&local_58);
    if (uVar3 == 0) {
      uVar3 = ref_list_shift(local_68,(REF_INT *)&local_94);
      if (uVar3 == 0) {
        uVar3 = ref_list_shift(local_78,&local_7c);
        pFVar2 = local_90;
        if (uVar3 == 0) {
          if (local_54 - 1U < 5) {
            uVar1 = *(undefined4 *)(&DAT_002143c0 + (ulong)(local_54 - 1U) * 4);
            *length = local_94;
            sVar4 = fread(&local_48,4,1,local_90);
            if (sVar4 == 1) {
              dVar17 = 299.0 - (double)local_48;
              if (dVar17 <= -dVar17) {
                dVar17 = -dVar17;
              }
              if (2.99e-10 < dVar17) {
                printf("%s: %d: %s: %s\nexpected %.15e, was %.15e, %e outside of %e\n",
                       0x4072b00000000000,(double)local_48,dVar17,0x3df48c1049e0a062,
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x99a,"ref_part_plt_data","start of data header expected");
                return 1;
              }
              local_68 = (REF_LIST)CONCAT44(local_68._4_4_,uVar1);
              if (0 < nvar) {
                RVar11 = nvar;
                do {
                  sVar4 = fread(&local_4c,4,1,pFVar2);
                  if (sVar4 != 1) {
                    pcVar9 = "dim";
                    uVar10 = 1;
                    uVar6 = 0x99d;
                    goto LAB_001f1b7c;
                  }
                  uVar3 = ref_list_push(local_70,local_4c);
                  if (uVar3 != 0) {
                    pcVar9 = "save dataformat";
                    uVar6 = 0x99e;
                    goto LAB_001f1902;
                  }
                  RVar11 = RVar11 + -1;
                } while (RVar11 != 0);
              }
              sVar4 = fread(&local_80,4,1,pFVar2);
              if (sVar4 == 1) {
                if (local_80 == 1 && 0 < nvar) {
                  RVar11 = nvar;
                  do {
                    sVar4 = fread(&local_80,4,1,pFVar2);
                    if (sVar4 != 1) {
                      pcVar9 = "dim";
                      uVar10 = 1;
                      uVar6 = 0x9a3;
                      goto LAB_001f1b7c;
                    }
                    sVar4 = (size_t)local_80;
                    if (sVar4 != 0) {
                      pcVar9 = "passive variable nonzero plt";
                      uVar6 = 0x9a4;
                      uVar10 = 0;
                      goto LAB_001f1b7c;
                    }
                    RVar11 = RVar11 + -1;
                  } while (RVar11 != 0);
                }
                sVar4 = fread(&local_84,4,1,pFVar2);
                if (sVar4 == 1) {
                  if (local_84 == 1 && 0 < nvar) {
                    RVar11 = nvar;
                    do {
                      sVar4 = fread(&local_84,4,1,pFVar2);
                      if (sVar4 != 1) {
                        pcVar9 = "dim";
                        uVar10 = 1;
                        uVar6 = 0x9aa;
                        goto LAB_001f1b7c;
                      }
                      sVar4 = (size_t)local_84;
                      if (sVar4 != 0xffffffffffffffff) {
                        pcVar9 = "variable sharing not implemented plt";
                        uVar6 = 0x9ab;
                        goto LAB_001f1d60;
                      }
                      RVar11 = RVar11 + -1;
                    } while (RVar11 != 0);
                  }
                  sVar4 = fread(&local_50,4,1,pFVar2);
                  pFVar2 = local_90;
                  if (sVar4 == 1) {
                    sVar4 = (size_t)local_50;
                    if (sVar4 == 0xffffffffffffffff) {
                      if (0 < nvar) {
                        RVar11 = nvar;
                        do {
                          sVar4 = fread(local_38,8,1,pFVar2);
                          if (sVar4 != 1) {
                            pcVar9 = "dim";
                            uVar10 = 1;
                            uVar6 = 0x9b2;
                            goto LAB_001f1b7c;
                          }
                          sVar4 = fread(local_40,8,1,pFVar2);
                          if (sVar4 != 1) {
                            pcVar9 = "dim";
                            uVar10 = 1;
                            uVar6 = 0x9b3;
                            goto LAB_001f1b7c;
                          }
                          RVar11 = RVar11 + -1;
                        } while (RVar11 != 0);
                      }
                      uVar3 = local_94;
                      uVar14 = (ulong)local_94;
                      if (-1 < (int)(local_94 * nvar)) {
                        pRVar5 = (REF_DBL *)malloc((ulong)(local_94 * nvar) << 3);
                        *soln = pRVar5;
                        if (pRVar5 == (REF_DBL *)0x0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x9b6,"ref_part_plt_data","malloc *soln of REF_DBL NULL");
                          return 2;
                        }
                        if (local_58 == 0) {
                          if (0 < nvar) {
                            local_78 = (REF_LIST)0x0;
                            uVar16 = 0;
                            do {
                              if (0 < (int)uVar14) {
                                lVar7 = 0;
                                pRVar13 = local_78;
                                do {
                                  if (local_70->value[uVar16] == 2) {
                                    sVar4 = fread(&local_60,8,1,local_90);
                                    dVar17 = local_60;
                                    if (sVar4 != 1) {
                                      pcVar9 = "double";
                                      uVar10 = 1;
                                      uVar6 = 0x9c3;
                                      goto LAB_001f1b7c;
                                    }
                                  }
                                  else {
                                    if (local_70->value[uVar16] != 1) {
                                      printf("dataformat = %d\n");
                                      uVar6 = 0x9c8;
                                      goto LAB_001f21b8;
                                    }
                                    sVar4 = fread(&local_88,4,1,local_90);
                                    if (sVar4 != 1) {
                                      pcVar9 = "float";
                                      uVar10 = 1;
                                      uVar6 = 0x9bf;
                                      goto LAB_001f1b7c;
                                    }
                                    dVar17 = (double)local_88;
                                  }
                                  *(double *)((long)*soln + (long)pRVar13) = dVar17;
                                  lVar7 = lVar7 + 1;
                                  uVar14 = (ulong)(int)local_94;
                                  pRVar13 = (REF_LIST)((long)&pRVar13->n + (ulong)(uint)nvar * 8);
                                } while (lVar7 < (long)uVar14);
                              }
                              uVar16 = uVar16 + 1;
                              local_78 = (REF_LIST)&local_78->value;
                            } while (uVar16 != (uint)nvar);
                          }
                        }
                        else if (0 < (int)uVar3) {
                          lVar7 = 0;
                          lVar12 = 0;
                          do {
                            if (0 < nvar) {
                              uVar14 = 0;
                              do {
                                if (local_70->value[uVar14] == 2) {
                                  sVar4 = fread(&local_60,8,1,local_90);
                                  dVar17 = local_60;
                                  if (sVar4 != 1) {
                                    pcVar9 = "double";
                                    uVar10 = 1;
                                    uVar6 = 0x9d6;
                                    goto LAB_001f1b7c;
                                  }
                                }
                                else {
                                  if (local_70->value[uVar14] != 1) {
                                    printf("dataformat = %d\n");
                                    uVar6 = 0x9db;
LAB_001f21b8:
                                    uVar3 = 6;
                                    pcVar9 = "implement tecplot plt dataformat read";
                                    uVar14 = 6;
                                    goto LAB_001f1905;
                                  }
                                  sVar4 = fread(&local_88,4,1,local_90);
                                  if (sVar4 != 1) {
                                    pcVar9 = "float";
                                    uVar10 = 1;
                                    uVar6 = 0x9d2;
                                    goto LAB_001f1b7c;
                                  }
                                  dVar17 = (double)local_88;
                                }
                                *(double *)((long)*soln + uVar14 * 8 + lVar7) = dVar17;
                                uVar14 = uVar14 + 1;
                              } while ((uint)nvar != uVar14);
                              uVar14 = (ulong)local_94;
                            }
                            lVar12 = lVar12 + 1;
                            lVar7 = lVar7 + (ulong)(uint)nvar * 8;
                          } while (lVar12 < (int)uVar14);
                        }
                        if (0 < local_7c) {
                          iVar8 = 0;
                          do {
                            iVar15 = (int)local_68;
                            do {
                              sVar4 = fread(local_44,4,1,local_90);
                              if (sVar4 != 1) {
                                pcVar9 = "dim";
                                uVar10 = 1;
                                uVar6 = 0x9e3;
                                goto LAB_001f1b7c;
                              }
                              iVar15 = iVar15 + -1;
                            } while (iVar15 != 0);
                            iVar8 = iVar8 + 1;
                          } while (iVar8 < local_7c);
                        }
                        ref_list_free(local_70);
                        return 0;
                      }
                      pcVar9 = "malloc *soln of REF_DBL negative";
                      uVar6 = 0x9b6;
                      goto LAB_001f1b48;
                    }
                    pcVar9 = "connectivity sharing not implemented plt";
                    uVar6 = 0x9af;
LAB_001f1d60:
                    uVar10 = 0xffffffffffffffff;
                  }
                  else {
                    pcVar9 = "dim";
                    uVar10 = 1;
                    uVar6 = 0x9ae;
                  }
                }
                else {
                  pcVar9 = "dim";
                  uVar10 = 1;
                  uVar6 = 0x9a7;
                }
              }
              else {
                pcVar9 = "dim";
                uVar10 = 1;
                uVar6 = 0x9a0;
              }
            }
            else {
              pcVar9 = "zonemarker";
              uVar10 = 1;
              uVar6 = 0x999;
            }
LAB_001f1b7c:
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar6,"ref_part_plt_data",pcVar9,uVar10,sVar4);
          }
          else {
            printf("zonetype = %d\n");
            pcVar9 = "unknown tecplot plt zonetype read";
            uVar6 = 0x991;
LAB_001f1b48:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar6,"ref_part_plt_data",pcVar9);
          }
          return 1;
        }
        pcVar9 = "zone elem size";
        uVar6 = 0x97d;
      }
      else {
        pcVar9 = "zone node size";
        uVar6 = 0x97c;
      }
    }
    else {
      pcVar9 = "zone packing";
      uVar6 = 0x97b;
    }
  }
  else {
    pcVar9 = "zonetype";
    uVar6 = 0x97a;
  }
LAB_001f1902:
  uVar14 = (ulong)uVar3;
LAB_001f1905:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar6,
         "ref_part_plt_data",uVar14,pcVar9);
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_part_plt_data(
    FILE *file, REF_INT nvar, REF_LIST zone_type, REF_LIST zone_packing,
    REF_LIST zone_nnode, REF_LIST zone_nelem, REF_INT *length, REF_DBL **soln) {
  float zonemarker;
  int dataformat;
  REF_INT i, node, elem, node_per;
  int passive, sharing, conn, c2n;
  double minval, maxval;
  REF_INT zonetype, packing, nnode, nelem;
  float var_float;
  double var_double;
  REF_LIST dataformats = NULL;
  REF_BOOL verbose = REF_FALSE;

  RSS(ref_list_create(&dataformats), "dataformats");

  RSS(ref_list_shift(zone_type, &zonetype), "zonetype");
  RSS(ref_list_shift(zone_packing, &packing), "zone packing");
  RSS(ref_list_shift(zone_nnode, &nnode), "zone node size");
  RSS(ref_list_shift(zone_nelem, &nelem), "zone elem size");

  switch (zonetype) {
    case 1: /* FELINESEG */
      node_per = 2;
      break;
    case 2: /* FETRIANGLE */
      node_per = 3;
      break;
    case 3: /* FEQUADRILATERAL */
      node_per = 4;
      break;
    case 4: /* FETETRAHEDRON */
      node_per = 4;
      break;
    case 5: /* FEBRICK */
      node_per = 8;
      break;
    default:
      printf("zonetype = %d\n", zonetype);
      THROW("unknown tecplot plt zonetype read");
  }
  if (verbose)
    printf("zone type %d node_per %d packing %d nnode %d nelem %d\n", zonetype,
           node_per, packing, nnode, nelem);

  *length = nnode;

  REIS(1, fread(&zonemarker, sizeof(float), 1, file), "zonemarker");
  RWDS(299.0, (double)zonemarker, -1.0, "start of data header expected");

  for (i = 0; i < nvar; i++) {
    REIS(1, fread(&dataformat, sizeof(int), 1, file), "dim");
    RSS(ref_list_push(dataformats, dataformat), "save dataformat");
  }
  REIS(1, fread(&passive, sizeof(int), 1, file), "dim");
  if (1 == passive) {
    for (i = 0; i < nvar; i++) {
      REIS(1, fread(&passive, sizeof(int), 1, file), "dim");
      REIS(0, passive, "passive variable nonzero plt");
    }
  }
  REIS(1, fread(&sharing, sizeof(int), 1, file), "dim");
  if (1 == sharing) {
    for (i = 0; i < nvar; i++) {
      REIS(1, fread(&sharing, sizeof(int), 1, file), "dim");
      REIS(-1, sharing, "variable sharing not implemented plt");
    }
  }
  REIS(1, fread(&conn, sizeof(int), 1, file), "dim");
  REIS(-1, conn, "connectivity sharing not implemented plt");

  for (i = 0; i < nvar; i++) {
    REIS(1, fread(&minval, sizeof(double), 1, file), "dim");
    REIS(1, fread(&maxval, sizeof(double), 1, file), "dim");
  }

  ref_malloc(*soln, nvar * nnode, REF_DBL);

  /* Data packing. 0 = Block 1 = Point */
  if (0 == packing) {
    for (i = 0; i < nvar; i++) {
      for (node = 0; node < nnode; node++) {
        dataformat = ref_list_value(dataformats, i);
        switch (dataformat) {
          case 1: /* float */
            REIS(1, fread(&var_float, sizeof(float), 1, file), "float");
            (*soln)[i + nvar * node] = (double)var_float;
            break;
          case 2: /* double */
            REIS(1, fread(&var_double, sizeof(double), 1, file), "double");
            (*soln)[i + nvar * node] = var_double;
            break;
          default:
            printf("dataformat = %d\n", dataformat);
            RSS(REF_IMPLEMENT, "implement tecplot plt dataformat read");
        }
      }
    }
  } else {
    for (node = 0; node < nnode; node++) {
      for (i = 0; i < nvar; i++) {
        dataformat = ref_list_value(dataformats, i);
        switch (dataformat) {
          case 1: /* float */
            REIS(1, fread(&var_float, sizeof(float), 1, file), "float");
            (*soln)[i + nvar * node] = (double)var_float;
            break;
          case 2: /* double */
            REIS(1, fread(&var_double, sizeof(double), 1, file), "double");
            (*soln)[i + nvar * node] = var_double;
            break;
          default:
            printf("dataformat = %d\n", dataformat);
            RSS(REF_IMPLEMENT, "implement tecplot plt dataformat read");
        }
      }
    }
  }

  for (elem = 0; elem < nelem; elem++) {
    for (i = 0; i < node_per; i++) {
      REIS(1, fread(&c2n, sizeof(int), 1, file), "dim");
    }
  }

  ref_list_free(dataformats);

  return REF_SUCCESS;
}